

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lcode.c
# Opt level: O1

void luaK_goiffalse(FuncState *fs,expdesc *e)

{
  expkind eVar1;
  int vtarget;
  int iVar2;
  
  luaK_dischargevars(fs,e);
  eVar1 = e->k;
  iVar2 = -1;
  if ((eVar1 != VNIL) && (eVar1 != VFALSE)) {
    if (eVar1 == VJMP) {
      iVar2 = (e->u).info;
    }
    else {
      iVar2 = jumponcond(fs,e,1);
    }
  }
  luaK_concat(fs,&e->t,iVar2);
  iVar2 = e->f;
  vtarget = fs->pc;
  fs->lasttarget = vtarget;
  patchlistaux(fs,iVar2,vtarget,0xff,vtarget);
  e->f = -1;
  return;
}

Assistant:

void luaK_goiffalse (FuncState *fs, expdesc *e) {
  int pc;  /* pc of new jump */
  luaK_dischargevars(fs, e);
  switch (e->k) {
    case VJMP: {
      pc = e->u.info;  /* already jump if true */
      break;
    }
    case VNIL: case VFALSE: {
      pc = NO_JUMP;  /* always false; do nothing */
      break;
    }
    default: {
      pc = jumponcond(fs, e, 1);  /* jump if true */
      break;
    }
  }
  luaK_concat(fs, &e->t, pc);  /* insert new jump in 't' list */
  luaK_patchtohere(fs, e->f);  /* false list jumps to here (to go through) */
  e->f = NO_JUMP;
}